

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

void golf_json_object_set_float_array
               (JSON_Object *obj,char *name,float *arr,int n,float min,float max)

{
  int iVar1;
  int local_58;
  int n__;
  int i__;
  int v_i;
  float v;
  int i;
  vec_char_t data;
  float max_local;
  float min_local;
  int n_local;
  float *arr_local;
  char *name_local;
  JSON_Object *obj_local;
  
  data.alloc_category._4_4_ = max;
  memset(&v,0,0x18);
  data._8_8_ = (long)"storage.json" + 8;
  for (v_i = 0; v_i < n; v_i = v_i + 1) {
    i__ = (int)((arr[v_i] - min) / (data.alloc_category._4_4_ - min));
    if (((float)i__ < min) || (data.alloc_category._4_4_ < (float)i__)) {
      golf_log_warning("Number too big");
    }
    n__ = (int)((float)i__ * 100000.0);
    iVar1 = vec_reserve_po2_((char **)&v,(int *)&data,(int *)((long)&data.data + 4),1,
                             (int)data.data + 4,(char *)data._8_8_);
    if (iVar1 == 0) {
      for (local_58 = 0; iVar1 = (int)data.data, local_58 < 4; local_58 = local_58 + 1) {
        data.data._0_4_ = (int)data.data + 1;
        _v[iVar1] = *(uchar *)((long)&n__ + (long)local_58);
      }
    }
  }
  golf_json_object_set_data(obj,name,_v,(int)data.data);
  golf_free_tracked(_v);
  return;
}

Assistant:

void golf_json_object_set_float_array(JSON_Object *obj, const char *name, float *arr, int n, float min, float max) {
    vec_char_t data;
    vec_init(&data, "json");

    for (int i = 0; i < n; i++) {
        float v = (arr[i] - min) / (max - min);
        if (v < min || v > max) golf_log_warning("Number too big");
        int v_i = (int)(v * (float)PRECISION);
        vec_pusharr(&data, (unsigned char *)&v_i, sizeof(v_i));
    }

    golf_json_object_set_data(obj, name, (unsigned char*)data.data, data.length);

    vec_deinit(&data);
}